

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<long,_8> * __thiscall
TPZManVector<long,_8>::operator=(TPZManVector<long,_8> *this,TPZManVector<long,_8> *rval)

{
  long lVar1;
  long *plVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  
  if (this != rval) {
    lVar1 = (rval->super_TPZVec<long>).fNElements;
    plVar2 = (this->super_TPZVec<long>).fStore;
    plVar5 = this->fExtAlloc;
    if (plVar2 != plVar5 && plVar2 != (long *)0x0) {
      operator_delete__(plVar2);
      (this->super_TPZVec<long>).fStore = (long *)0x0;
      (this->super_TPZVec<long>).fNAlloc = 0;
    }
    if (lVar1 < 9) {
      lVar4 = 0;
      uVar3 = 0;
      if (0 < lVar1) {
        do {
          plVar5[lVar4] = rval->fExtAlloc[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
        uVar3 = (uint)lVar1;
      }
      if (uVar3 < 8) {
        memset((void *)((long)this->fExtAlloc + (ulong)(uVar3 * 8)),0,(ulong)(uVar3 * -8 + 0x40));
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
      }
    }
    else {
      plVar5 = (rval->super_TPZVec<long>).fStore;
      lVar4 = lVar1;
    }
    (this->super_TPZVec<long>).fStore = plVar5;
    (this->super_TPZVec<long>).fNAlloc = lVar4;
    (this->super_TPZVec<long>).fNElements = lVar1;
  }
  (rval->super_TPZVec<long>).fStore = (long *)0x0;
  (rval->super_TPZVec<long>).fNElements = 0;
  (rval->super_TPZVec<long>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}